

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeIdentifier
          (ParserImpl *this,string *identifier)

{
  bool bVar1;
  Token *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *identifier_local;
  ParserImpl *this_local;
  
  local_20 = identifier;
  identifier_local = (string *)this;
  bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    std::__cxx11::string::operator=((string *)local_20,(string *)&pTVar2->text);
    io::Tokenizer::Next(&this->tokenizer_);
    this_local._7_1_ = true;
  }
  else if ((((this->allow_field_number_ & 1U) == 0) && ((this->allow_unknown_field_ & 1U) == 0)) ||
          (bVar1 = LookingAtType(this,TYPE_INTEGER), !bVar1)) {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    std::operator+(&local_40,"Expected identifier, got: ",&pTVar2->text);
    ReportError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this_local._7_1_ = false;
  }
  else {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    std::__cxx11::string::operator=((string *)local_20,(string *)&pTVar2->text);
    io::Tokenizer::Next(&this->tokenizer_);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ConsumeIdentifier(string* identifier) {
    if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    // If allow_field_numer_ or allow_unknown_field_ is true, we should able
    // to parse integer identifiers.
    if ((allow_field_number_ || allow_unknown_field_)
        && LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    ReportError("Expected identifier, got: " + tokenizer_.current().text);
    return false;
  }